

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_rastrip(CHAR_DATA *ch,char *argument)

{
  char *in_RSI;
  long in_RDI;
  ROOM_INDEX_DATA *location;
  ROOM_AFFECT_DATA *af_next;
  ROOM_AFFECT_DATA *af;
  ROOM_AFFECT_DATA *in_stack_00000028;
  ROOM_INDEX_DATA *in_stack_00000030;
  ROOM_INDEX_DATA *arg2;
  ROOM_AFFECT_DATA *in_stack_ffffffffffffffe0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  ROOM_AFFECT_DATA *pRVar1;
  
  arg2 = (ROOM_INDEX_DATA *)0x0;
  if (*in_RSI == '\0') {
    arg2 = *(ROOM_INDEX_DATA **)(in_RDI + 0xa8);
  }
  if ((arg2 == (ROOM_INDEX_DATA *)0x0) &&
     (arg2 = find_location(in_stack_ffffffffffffffe8,(char *)in_stack_ffffffffffffffe0),
     arg2 == (ROOM_INDEX_DATA *)0x0)) {
    send_to_char(in_RSI,in_stack_ffffffffffffffe8);
    return;
  }
  pRVar1 = arg2->affected;
  while (pRVar1 != (ROOM_AFFECT_DATA *)0x0) {
    in_stack_ffffffffffffffe0 = pRVar1->next;
    affect_remove_room(in_stack_00000030,in_stack_00000028);
    pRVar1 = in_stack_ffffffffffffffe0;
  }
  act(in_RSI,(CHAR_DATA *)0x0,in_stack_ffffffffffffffe0,arg2,0);
  return;
}

Assistant:

void do_rastrip(CHAR_DATA *ch, char *argument)
{
	ROOM_AFFECT_DATA *af, *af_next;
	ROOM_INDEX_DATA *location = nullptr;

	if (argument[0] == '\0')
		location = ch->in_room;

	if (location == nullptr && (location = find_location(ch, argument)) == nullptr)
	{
		send_to_char("No such room exists.\n\r", ch);
		return;
	}

	for (af = location->affected; af != nullptr; af = af_next)
	{
		af_next = af->next;
		affect_remove_room(location, af);
	}

	act("All affects stripped from '$t'.", ch, location->name, 0, TO_CHAR);
}